

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

int boost::filesystem::detail::lex_compare
              (iterator *first1,iterator *last1,iterator *first2,iterator *last2)

{
  size_t __n;
  int iVar1;
  size_type sVar2;
  path *ppVar3;
  size_type sVar4;
  path *ppVar5;
  
  ppVar3 = first1->m_path_ptr;
  sVar2 = first1->m_pos;
  ppVar5 = last1->m_path_ptr;
  sVar4 = last1->m_pos;
  while( true ) {
    if ((sVar2 == sVar4 && ppVar3 == ppVar5) ||
       ((first2->m_path_ptr == last2->m_path_ptr && (first2->m_pos == last2->m_pos)))) {
      iVar1 = 1;
      if ((ppVar3 == ppVar5) && (sVar2 == sVar4)) {
        iVar1 = -(uint)(last2->m_pos != first2->m_pos || first2->m_path_ptr != last2->m_path_ptr);
      }
      return iVar1;
    }
    iVar1 = std::__cxx11::string::compare((string *)first1);
    if (iVar1 < 0) {
      return -1;
    }
    iVar1 = std::__cxx11::string::compare((string *)first2);
    if (iVar1 < 0) break;
    __n = (first2->m_element).m_pathname._M_string_length;
    if ((__n != (first1->m_element).m_pathname._M_string_length) ||
       ((__n != 0 &&
        (iVar1 = bcmp((first2->m_element).m_pathname._M_dataplus._M_p,
                      (first1->m_element).m_pathname._M_dataplus._M_p,__n), iVar1 != 0)))) {
      __assert_fail("first2->native() == first1->native()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/path.cpp"
                    ,699,
                    "int boost::filesystem::detail::lex_compare(path::iterator, path::iterator, path::iterator, path::iterator)"
                   );
    }
    path::m_path_iterator_increment(first1);
    path::m_path_iterator_increment(first2);
    ppVar3 = first1->m_path_ptr;
    sVar2 = first1->m_pos;
    ppVar5 = last1->m_path_ptr;
    sVar4 = last1->m_pos;
  }
  return 1;
}

Assistant:

BOOST_FILESYSTEM_DECL
      int lex_compare(path::iterator first1, path::iterator last1,
        path::iterator first2, path::iterator last2)
    {
      for (; first1 != last1 && first2 != last2;)
      {
        if (first1->native() < first2->native()) return -1;
        if (first2->native() < first1->native()) return 1;
        BOOST_ASSERT(first2->native() == first1->native());
        ++first1;
        ++first2;
      }
      if (first1 == last1 && first2 == last2)
        return 0;
      return first1 == last1 ? -1 : 1;
    }